

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.cpp
# Opt level: O0

void __thiscall Room::shuffleTiles(Room *this)

{
  rep rVar1;
  iterator __first;
  iterator __last;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_30;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28;
  duration<long,_std::ratio<1L,_1000000000L>_> local_20;
  uint local_14;
  Room *pRStack_10;
  uint seed;
  Room *this_local;
  
  pRStack_10 = this;
  local_28.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_20.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_28);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_20);
  local_14 = (uint)rVar1;
  __first = std::array<Tile,_144UL>::begin(&this->tiles);
  __last = std::array<Tile,_144UL>::end(&this->tiles);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(&local_30,(ulong)local_14);
  std::shuffle<Tile*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            (__first,__last,&local_30);
  return;
}

Assistant:

void Room::shuffleTiles() {
    unsigned seed = std::chrono::system_clock::now().time_since_epoch().count();
    shuffle(tiles.begin(), tiles.end(), std::default_random_engine(seed));
}